

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_posix.h
# Opt level: O0

uint64_t snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::internal_time_in_ms(void)

{
  int iVar1;
  KeepErrno *this;
  timespec ts;
  char *in_stack_00000020;
  KeepErrno hold;
  KeepErrno *in_stack_ffffffffffffffe0;
  timespec local_18;
  
  KeepErrno::KeepErrno(in_stack_ffffffffffffffe0);
  iVar1 = clock_gettime(1,&local_18);
  if (iVar1 == -1) {
    error(in_stack_00000020);
  }
  this = (KeepErrno *)(local_18.tv_sec * 1000 + (ulong)local_18.tv_nsec / 1000000);
  KeepErrno::~KeepErrno(this);
  return (uint64_t)this;
}

Assistant:

static uint64_t internal_time_in_ms()
    {
      auto hold = KeepErrno();

      struct timespec ts;
      if (clock_gettime(CLOCK_MONOTONIC, &ts) == -1)
      {
        error("Failed to get time");
      }

      return (static_cast<uint64_t>(ts.tv_sec) * 1000) +
        (static_cast<uint64_t>(ts.tv_nsec) / 1000000);
    }